

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall
CSmoothTime::Update(CSmoothTime *this,CGraph *pGraph,int64 Target,int TimeLeft,int AdjustDirection)

{
  int iVar1;
  float fVar2;
  
  if (TimeLeft < 0) {
    if ((uint)TimeLeft < 0xffffffce) {
      iVar1 = 0x32;
      if (this->m_SpikeCounter < 0x2e) {
        iVar1 = this->m_SpikeCounter + 5;
      }
      this->m_SpikeCounter = iVar1;
      if (iVar1 < 0xf) {
        CGraph::Add(pGraph,(float)TimeLeft,1.0,1.0,0.3);
        iVar1 = this->m_BadnessScore + 10;
        goto LAB_001171a3;
      }
    }
    CGraph::Add(pGraph,(float)TimeLeft,1.0,0.3,0.3);
    this->m_BadnessScore = this->m_BadnessScore + 0x32;
    fVar2 = this->m_aAdjustSpeed[AdjustDirection];
    if (fVar2 < 30.0) {
      this->m_aAdjustSpeed[AdjustDirection] = fVar2 + fVar2;
    }
  }
  else {
    if (this->m_SpikeCounter != 0) {
      this->m_SpikeCounter = this->m_SpikeCounter + -1;
    }
    CGraph::Add(pGraph,(float)TimeLeft,0.3,1.0,0.3);
    fVar2 = this->m_aAdjustSpeed[AdjustDirection] * 0.95;
    this->m_aAdjustSpeed[AdjustDirection] = fVar2;
    if (fVar2 < 2.0) {
      this->m_aAdjustSpeed[AdjustDirection] = 2.0;
    }
  }
  UpdateInt(this,Target);
  iVar1 = this->m_BadnessScore;
LAB_001171a3:
  this->m_BadnessScore = ~(iVar1 / 100) + iVar1;
  return;
}

Assistant:

void CSmoothTime::Update(CGraph *pGraph, int64 Target, int TimeLeft, int AdjustDirection)
{
	int UpdateTimer = 1;

	if(TimeLeft < 0)
	{
		int IsSpike = 0;
		if(TimeLeft < -50)
		{
			IsSpike = 1;

			m_SpikeCounter += 5;
			if(m_SpikeCounter > 50)
				m_SpikeCounter = 50;
		}

		if(IsSpike && m_SpikeCounter < 15)
		{
			// ignore this ping spike
			UpdateTimer = 0;
			pGraph->Add(TimeLeft, 1,1,0.3f); // yellow
			m_BadnessScore += 10;
		}
		else
		{
			pGraph->Add(TimeLeft, 1,0.3f,0.3f); // red
			m_BadnessScore += 50;
			if(m_aAdjustSpeed[AdjustDirection] < 30.0f)
				m_aAdjustSpeed[AdjustDirection] *= 2.0f;
		}
	}
	else
	{
		if(m_SpikeCounter)
			m_SpikeCounter--;

		pGraph->Add(TimeLeft, 0.3f,1,0.3f); // green

		m_aAdjustSpeed[AdjustDirection] *= 0.95f;
		if(m_aAdjustSpeed[AdjustDirection] < 2.0f)
			m_aAdjustSpeed[AdjustDirection] = 2.0f;
	}

	if(UpdateTimer)
		UpdateInt(Target);

	m_BadnessScore -= 1+m_BadnessScore/100;
}